

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_must(lyout *out,lys_restr *must,uint8_t must_size)

{
  int local_20;
  int i;
  uint8_t must_size_local;
  lys_restr *must_local;
  lyout *out_local;
  
  ly_print(out,"%-*s",0xb,"Must: ");
  if (must_size == '\0') {
    ly_print(out,"\n");
  }
  else {
    ly_print(out,"%s\n",must->expr);
    for (local_20 = 1; local_20 < (int)(uint)must_size; local_20 = local_20 + 1) {
      ly_print(out,"%*s%s\n",0xb,"",must[local_20].expr);
    }
  }
  return;
}

Assistant:

static void
info_print_must(struct lyout *out, const struct lys_restr *must, uint8_t must_size)
{
    int i;

    ly_print(out, "%-*s", INDENT_LEN, "Must: ");

    if (must_size) {
        ly_print(out, "%s\n", must[0].expr);
        for (i = 1; i < must_size; ++i) {
            ly_print(out, "%*s%s\n", INDENT_LEN, "", must[i].expr);
        }
    } else {
        ly_print(out, "\n");
    }
}